

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  uint *puVar2;
  ZSTD_entropyCTables_t *pZVar3;
  undefined8 in_RAX;
  long lVar4;
  U32 UVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint lit;
  uint lit_1;
  undefined8 uStack_28;
  
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      lVar4 = 0;
      optPtr->priceType = zop_dynamic;
      optPtr->litSum = 0;
      do {
        UVar5 = HUF_getNbBits(optPtr->symbolCosts,(U32)lVar4);
        uVar6 = 1 << (0xbU - (char)UVar5 & 0x1f);
        if (UVar5 == 0) {
          uVar6 = 1;
        }
        optPtr->litFreq[lVar4] = uVar6;
        optPtr->litSum = optPtr->litSum + uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      puVar2 = optPtr->litLengthFreq;
      pZVar3 = optPtr->symbolCosts;
      sVar1 = (short)(pZVar3->fse).litlengthCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar7 = 0;
      do {
        uVar6 = (pZVar3->fse).litlengthCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar8 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar8 = 1;
        }
        puVar2[lVar7] = uVar8;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x24);
      sVar1 = (short)(pZVar3->fse).matchlengthCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      puVar2 = optPtr->matchLengthFreq;
      lVar7 = 0;
      do {
        uVar6 = (pZVar3->fse).matchlengthCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar8 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar8 = 1;
        }
        puVar2[lVar7] = uVar8;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x35);
      sVar1 = (short)(pZVar3->fse).offcodeCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      puVar2 = optPtr->offCodeFreq;
      lVar7 = 0;
      do {
        uVar6 = (pZVar3->fse).offcodeCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar8 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar8 = 1;
        }
        puVar2[lVar7] = uVar8;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      goto LAB_00513bdc;
    }
    uStack_28 = CONCAT44(0xff,(int)in_RAX);
    HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
    puVar2 = optPtr->litFreq;
    lVar4 = 0;
    UVar5 = 0;
    do {
      uVar6 = puVar2[lVar4] >> 5;
      puVar2[lVar4] = uVar6 + 1;
      UVar5 = UVar5 + uVar6 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    optPtr->litSum = UVar5;
    puVar2 = optPtr->litLengthFreq;
    lVar4 = 0;
    do {
      puVar2[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x24);
    optPtr->litLengthSum = 0x24;
    puVar2 = optPtr->matchLengthFreq;
    lVar4 = 0;
    do {
      puVar2[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x35);
    optPtr->matchLengthSum = 0x35;
    puVar2 = optPtr->offCodeFreq;
    lVar4 = 0;
    do {
      puVar2[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    UVar5 = 0x20;
  }
  else {
    puVar2 = optPtr->litFreq;
    lVar4 = 0;
    UVar5 = 0;
    do {
      uVar6 = puVar2[lVar4] >> 5;
      puVar2[lVar4] = uVar6 + 1;
      UVar5 = UVar5 + uVar6 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    optPtr->litSum = UVar5;
    puVar2 = optPtr->litLengthFreq;
    lVar4 = 0;
    UVar5 = 0;
    do {
      uVar6 = puVar2[lVar4] >> 4;
      puVar2[lVar4] = uVar6 + 1;
      UVar5 = UVar5 + uVar6 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x24);
    optPtr->litLengthSum = UVar5;
    puVar2 = optPtr->matchLengthFreq;
    lVar4 = 0;
    UVar5 = 0;
    do {
      uVar6 = puVar2[lVar4] >> 4;
      puVar2[lVar4] = uVar6 + 1;
      UVar5 = UVar5 + uVar6 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x35);
    optPtr->matchLengthSum = UVar5;
    puVar2 = optPtr->offCodeFreq;
    lVar4 = 0;
    UVar5 = 0;
    do {
      uVar6 = puVar2[lVar4] >> 4;
      puVar2[lVar4] = uVar6 + 1;
      UVar5 = UVar5 + uVar6 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  optPtr->offCodeSum = UVar5;
LAB_00513bdc:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            assert(optPtr->litFreq != NULL);
            optPtr->litSum = 0;
            {   unsigned lit;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            {   unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
            }
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}